

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::ActivationLayer::backpropInplace(ActivationLayer *this,Array *errors)

{
  element_type *peVar1;
  Activation *pAVar2;
  float *y_begin;
  float *z_begin;
  size_t sVar3;
  float *pfVar4;
  float *pfVar5;
  float *z_end;
  float *x_begin;
  float extraout_XMM0_Da;
  
  peVar1 = (this->super_ABackpropLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar3 = peVar1->_M_size;
  pfVar4 = peVar1->_M_data;
  pfVar5 = pfVar4 + sVar3;
  if (sVar3 == 0) {
    pfVar5 = (float *)0x0;
    pfVar4 = (float *)0x0;
  }
  sVar3 = (this->activationGrad)._M_size;
  x_begin = (this->activationGrad)._M_data;
  if (pfVar4 != pfVar5) {
    pAVar2 = this->activationFunction;
    if (sVar3 == 0) {
      x_begin = (float *)0x0;
    }
    do {
      (*pAVar2->_vptr_Activation[2])(*pfVar4,pAVar2);
      *x_begin = extraout_XMM0_Da;
      pfVar4 = pfVar4 + 1;
      x_begin = x_begin + 1;
    } while (pfVar4 != pfVar5);
    sVar3 = (this->activationGrad)._M_size;
    x_begin = (this->activationGrad)._M_data;
  }
  pfVar5 = x_begin + sVar3;
  if (sVar3 == 0) {
    pfVar5 = (float *)0x0;
    x_begin = (float *)0x0;
  }
  y_begin = errors->_M_data;
  pfVar4 = y_begin + errors->_M_size;
  if (errors->_M_size == 0) {
    pfVar4 = (float *)0x0;
    y_begin = (float *)0x0;
  }
  sVar3 = (this->propagatedErrors)._M_size;
  z_begin = (this->propagatedErrors)._M_data;
  z_end = z_begin + sVar3;
  if (sVar3 == 0) {
    z_end = (float *)0x0;
    z_begin = (float *)0x0;
  }
  internal::emul<float*,float_const*,float*>(x_begin,pfVar5,y_begin,pfVar4,z_begin,z_end);
  return;
}

Assistant:

virtual void backpropInplace(const Array &errors) {
        auto &inputs = *shared.inputBuffer;
        auto &activation = (*activationFunction);
        std::transform(
            std::begin(inputs), std::end(inputs),
            std::begin(activationGrad),
            [&](float y) { return activation.derivative(y); });
#ifdef NOTCH_DISABLE_OPTIMIZATIONS
        propagatedErrors = activationGrad * errors;
#else /* optimized version */
        internal::emul(std::begin(activationGrad), std::end(activationGrad),
                       std::begin(errors), std::end(errors),
                       std::begin(propagatedErrors), std::end(propagatedErrors));
#endif
    }